

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O1

void __thiscall
chrono::utils::MixtureIngredient::setMaterialProperties
          (MixtureIngredient *this,shared_ptr<chrono::ChMaterialSurfaceSMC> *mat)

{
  float fVar1;
  float fVar2;
  element_type *peVar3;
  element_type *peVar4;
  normal_distribution<float> *pnVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  result_type_conflict1 rVar11;
  
  peVar3 = (this->m_defMaterialSMC).
           super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (peVar4->super_ChMaterialSurface).restitution = (peVar3->super_ChMaterialSurface).restitution;
  fVar1 = (peVar3->super_ChMaterialSurface).sliding_friction;
  fVar2 = (peVar3->super_ChMaterialSurface).rolling_friction;
  fVar6 = (peVar3->super_ChMaterialSurface).spinning_friction;
  (peVar4->super_ChMaterialSurface).static_friction =
       (peVar3->super_ChMaterialSurface).static_friction;
  (peVar4->super_ChMaterialSurface).sliding_friction = fVar1;
  (peVar4->super_ChMaterialSurface).rolling_friction = fVar2;
  (peVar4->super_ChMaterialSurface).spinning_friction = fVar6;
  peVar4->gt = peVar3->gt;
  fVar1 = peVar3->constant_adhesion;
  fVar2 = peVar3->adhesionMultDMT;
  fVar6 = peVar3->adhesionSPerko;
  fVar7 = peVar3->kn;
  fVar8 = peVar3->kt;
  fVar9 = peVar3->gn;
  *(undefined8 *)&(peVar4->super_ChMaterialSurface).field_0x1c =
       *(undefined8 *)&(peVar3->super_ChMaterialSurface).field_0x1c;
  peVar4->constant_adhesion = fVar1;
  peVar4->adhesionMultDMT = fVar2;
  peVar4->adhesionSPerko = fVar6;
  peVar4->kn = fVar7;
  peVar4->kt = fVar8;
  peVar4->gn = fVar9;
  pnVar5 = this->m_youngDist;
  if (pnVar5 != (normal_distribution<float> *)0x0) {
    peVar3 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    fVar1 = this->m_minYoung;
    fVar2 = this->m_maxYoung;
    do {
      if (rengine()::re == '\0') {
        iVar10 = __cxa_guard_acquire(&rengine()::re);
        if (iVar10 != 0) {
          rengine()::re =
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               ::operator_new(8);
          rengine()::re->_M_x = 1;
          __cxa_guard_release(&rengine()::re);
        }
      }
      rVar11 = std::normal_distribution<float>::operator()(pnVar5,rengine()::re,&pnVar5->_M_param);
    } while ((rVar11 < fVar1) || (fVar2 < rVar11));
    *(result_type_conflict1 *)&(peVar3->super_ChMaterialSurface).field_0x1c = rVar11;
  }
  pnVar5 = this->m_poissonDist;
  if (pnVar5 != (normal_distribution<float> *)0x0) {
    peVar3 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    fVar1 = this->m_minPoisson;
    fVar2 = this->m_maxPoisson;
    do {
      if (rengine()::re == '\0') {
        iVar10 = __cxa_guard_acquire(&rengine()::re);
        if (iVar10 != 0) {
          rengine()::re =
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               ::operator_new(8);
          rengine()::re->_M_x = 1;
          __cxa_guard_release(&rengine()::re);
        }
      }
      rVar11 = std::normal_distribution<float>::operator()(pnVar5,rengine()::re,&pnVar5->_M_param);
    } while ((rVar11 < fVar1) || (fVar2 < rVar11));
    peVar3->poisson_ratio = rVar11;
  }
  pnVar5 = this->m_frictionDist;
  if (pnVar5 != (normal_distribution<float> *)0x0) {
    peVar3 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    fVar1 = this->m_minFriction;
    fVar2 = this->m_maxFriction;
    do {
      if (rengine()::re == '\0') {
        iVar10 = __cxa_guard_acquire(&rengine()::re);
        if (iVar10 != 0) {
          rengine()::re =
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               ::operator_new(8);
          rengine()::re->_M_x = 1;
          __cxa_guard_release(&rengine()::re);
        }
      }
      rVar11 = std::normal_distribution<float>::operator()(pnVar5,rengine()::re,&pnVar5->_M_param);
    } while ((rVar11 < fVar1) || (fVar2 < rVar11));
    ChMaterialSurface::SetFriction(&peVar3->super_ChMaterialSurface,rVar11);
  }
  pnVar5 = this->m_restitutionDist;
  if (pnVar5 != (normal_distribution<float> *)0x0) {
    peVar3 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    fVar1 = this->m_minRestitution;
    fVar2 = this->m_maxRestitution;
    do {
      if (rengine()::re == '\0') {
        iVar10 = __cxa_guard_acquire(&rengine()::re);
        if (iVar10 != 0) {
          rengine()::re =
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               ::operator_new(8);
          rengine()::re->_M_x = 1;
          __cxa_guard_release(&rengine()::re);
        }
      }
      rVar11 = std::normal_distribution<float>::operator()(pnVar5,rengine()::re,&pnVar5->_M_param);
    } while ((rVar11 < fVar1) || (fVar2 < rVar11));
    (peVar3->super_ChMaterialSurface).restitution = rVar11;
  }
  pnVar5 = this->m_cohesionDist;
  if (pnVar5 != (normal_distribution<float> *)0x0) {
    peVar3 = (mat->super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    fVar1 = this->m_minCohesion;
    fVar2 = this->m_maxCohesion;
    do {
      if (rengine()::re == '\0') {
        iVar10 = __cxa_guard_acquire(&rengine()::re);
        if (iVar10 != 0) {
          rengine()::re =
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               ::operator_new(8);
          rengine()::re->_M_x = 1;
          __cxa_guard_release(&rengine()::re);
        }
      }
      rVar11 = std::normal_distribution<float>::operator()(pnVar5,rengine()::re,&pnVar5->_M_param);
    } while ((rVar11 < fVar1) || (fVar2 < rVar11));
    peVar3->constant_adhesion = rVar11;
  }
  return;
}

Assistant:

void MixtureIngredient::setMaterialProperties(std::shared_ptr<ChMaterialSurfaceSMC> mat) {
    // Copy properties from the default material.
    *mat = *m_defMaterialSMC;

    // If using distributions for any of the supported properties, override those.
    if (m_youngDist)
        mat->SetYoungModulus(sampleTruncatedDist<float>(*m_youngDist, m_minYoung, m_maxYoung));

    if (m_poissonDist)
        mat->SetPoissonRatio(sampleTruncatedDist<float>(*m_poissonDist, m_minPoisson, m_maxPoisson));

    if (m_frictionDist)
        mat->SetFriction(sampleTruncatedDist<float>(*m_frictionDist, m_minFriction, m_maxFriction));

    if (m_restitutionDist)
        mat->SetRestitution(sampleTruncatedDist<float>(*m_restitutionDist, m_minRestitution, m_maxRestitution));

    if (m_cohesionDist)
        mat->SetAdhesion(sampleTruncatedDist<float>(*m_cohesionDist, m_minCohesion, m_maxCohesion));
}